

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

void expr_index(FuncState *fs,ExpDesc *t,ExpDesc *e)

{
  anon_union_8_3_2ce71dea_for_u aVar1;
  uint uVar2;
  BCReg BVar3;
  
  t->k = VINDEXED;
  if (e->k == VKSTR) {
    BVar3 = const_str(fs,e);
    if (BVar3 < 0x100) {
      uVar2 = ~BVar3;
      goto LAB_00116a47;
    }
  }
  else if (e->k == VKLAST) {
    aVar1 = e->u;
    if ((((uint)(int)(double)aVar1 < 0x100) && ((double)aVar1 == (double)(int)(double)aVar1)) &&
       (!NAN((double)aVar1) && !NAN((double)(int)(double)aVar1))) {
      uVar2 = (int)(double)aVar1 | 0x100;
      goto LAB_00116a47;
    }
  }
  uVar2 = expr_toanyreg(fs,e);
LAB_00116a47:
  (t->u).s.aux = uVar2;
  return;
}

Assistant:

static void expr_index(FuncState *fs, ExpDesc *t, ExpDesc *e)
{
  /* Already called: expr_toval(fs, e). */
  t->k = VINDEXED;
  if (expr_isnumk(e)) {
#if LJ_DUALNUM
    if (tvisint(expr_numtv(e))) {
      int32_t k = intV(expr_numtv(e));
      if (checku8(k)) {
	t->u.s.aux = BCMAX_C+1+(uint32_t)k;  /* 256..511: const byte key */
	return;
      }
    }
#else
    lua_Number n = expr_numberV(e);
    int32_t k = lj_num2int(n);
    if (checku8(k) && n == (lua_Number)k) {
      t->u.s.aux = BCMAX_C+1+(uint32_t)k;  /* 256..511: const byte key */
      return;
    }
#endif
  } else if (expr_isstrk(e)) {
    BCReg idx = const_str(fs, e);
    if (idx <= BCMAX_C) {
      t->u.s.aux = ~idx;  /* -256..-1: const string key */
      return;
    }
  }
  t->u.s.aux = expr_toanyreg(fs, e);  /* 0..255: register */
}